

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_64.c
# Opt level: O3

parasail_result_t *
parasail_sw_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  __m256i alVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  __m256i c;
  int iVar7;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar8;
  __m256i *palVar9;
  __m256i *b_00;
  ulong uVar10;
  long lVar11;
  __m256i *ptr;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  __m256i *palVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 in_stack_ffffffffffffff38;
  uint uVar36;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar37;
  undefined1 auVar26 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar14 = profile->s1Len;
        if ((int)uVar14 < 1) {
          parasail_sw_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_64_cold_1();
        }
        else {
          iVar7 = ppVar4->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar37 = 0;
            uVar10 = (ulong)uVar14 + 3;
            uVar19 = uVar10 >> 2;
            result->flag = result->flag | 0x4800804;
            b = parasail_memalign___m256i(0x20,uVar19);
            palVar8 = parasail_memalign___m256i(0x20,uVar19);
            palVar9 = parasail_memalign___m256i(0x20,uVar19);
            b_00 = parasail_memalign___m256i(0x20,uVar19);
            if ((b_00 != (__m256i *)0x0 && palVar9 != (__m256i *)0x0) &&
                (palVar8 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              auVar22._4_4_ = 0;
              auVar22._0_4_ = open;
              auVar22._8_4_ = open;
              auVar22._12_4_ = 0;
              auVar22._16_4_ = open;
              auVar22._20_4_ = 0;
              auVar22._24_4_ = open;
              auVar22._28_4_ = 0;
              auVar23._4_4_ = 0;
              auVar23._0_4_ = gap;
              auVar23._8_4_ = gap;
              auVar23._12_4_ = 0;
              auVar23._16_4_ = gap;
              auVar23._20_4_ = 0;
              auVar23._24_4_ = gap;
              auVar23._28_4_ = 0;
              alVar2[1] = (longlong)result;
              alVar2[0] = in_stack_ffffffffffffff38;
              alVar2[2]._0_4_ = open;
              alVar2[2]._4_4_ = in_stack_ffffffffffffff4c;
              alVar2[3]._0_4_ = s2Len;
              alVar2[3]._4_4_ = uVar37;
              parasail_memset___m256i(b,alVar2,uVar19);
              c[1] = (longlong)result;
              c[0] = in_stack_ffffffffffffff38;
              c[2]._0_4_ = open;
              c[2]._4_4_ = in_stack_ffffffffffffff4c;
              c[3]._0_4_ = s2Len;
              c[3]._4_4_ = uVar37;
              parasail_memset___m256i(b_00,c,uVar19);
              uVar18 = 0;
              uVar36 = (uint)uVar19;
              lVar11 = -0x4000000000000000;
              auVar25._8_8_ = 0xc000000000000000;
              auVar25._0_8_ = 0xc000000000000000;
              auVar25._16_8_ = 0xc000000000000000;
              auVar25._24_8_ = 0xc000000000000000;
              auVar26 = ZEXT3264(auVar25);
              uVar13 = 0;
              auVar24 = ZEXT3264(auVar25);
              do {
                ptr = b;
                iVar15 = ppVar4->mapper[(byte)s2[uVar13]];
                uVar12 = (uint)uVar13;
                palVar20 = palVar9;
                b = palVar8;
                if (uVar18 == uVar12 - 2) {
                  palVar20 = palVar8;
                  b = palVar9;
                }
                alVar2 = ptr[uVar36 - 1];
                auVar25 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,8);
                auVar25 = vpalignr_avx2((undefined1  [32])alVar2,auVar25,8);
                lVar16 = 0;
                auVar31 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar29 = vpaddq_avx2(auVar25,*(undefined1 (*) [32])
                                                 ((long)pvVar3 +
                                                 lVar16 + (long)iVar15 * uVar19 * 0x20));
                  auVar25 = *(undefined1 (*) [32])((long)*b_00 + lVar16);
                  auVar30 = vpcmpgtq_avx2(auVar29,auVar25);
                  auVar29 = vblendvpd_avx(auVar25,auVar29,auVar30);
                  auVar28 = auVar31._0_32_;
                  auVar30 = vpcmpgtq_avx2(auVar29,auVar28);
                  auVar29 = vblendvpd_avx(auVar28,auVar29,auVar30);
                  auVar30 = vpcmpgtq_avx2(auVar29,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar30 = vpand_avx2(auVar30,auVar29);
                  *(undefined1 (*) [32])((long)*b + lVar16) = auVar30;
                  auVar29 = vpcmpgtq_avx2(auVar30,auVar24._0_32_);
                  auVar29 = vblendvpd_avx(auVar24._0_32_,auVar30,auVar29);
                  auVar24 = ZEXT3264(auVar29);
                  auVar29 = vpsubq_avx2(auVar30,auVar22);
                  auVar30 = vpsubq_avx2(auVar25,auVar23);
                  auVar25 = vpcmpgtq_avx2(auVar30,auVar29);
                  auVar25 = vblendvpd_avx(auVar29,auVar30,auVar25);
                  *(undefined1 (*) [32])((long)*b_00 + lVar16) = auVar25;
                  auVar30 = vpsubq_avx2(auVar28,auVar23);
                  auVar25 = vpcmpgtq_avx2(auVar30,auVar29);
                  auVar25 = vblendvpd_avx(auVar29,auVar30,auVar25);
                  auVar31 = ZEXT3264(auVar25);
                  auVar25 = *(undefined1 (*) [32])((long)*ptr + lVar16);
                  lVar16 = lVar16 + 0x20;
                } while (uVar19 << 5 != lVar16);
                iVar15 = 0;
                do {
                  auVar29 = auVar31._0_32_;
                  auVar25 = vperm2f128_avx(auVar29,auVar29,8);
                  auVar25 = vpalignr_avx2(auVar29,auVar25,8);
                  auVar31 = ZEXT3264(auVar25);
                  lVar16 = 0;
                  do {
                    auVar25 = *(undefined1 (*) [32])((long)*b + lVar16);
                    auVar30 = auVar31._0_32_;
                    auVar29 = vpcmpgtq_avx2(auVar25,auVar30);
                    auVar25 = vblendvpd_avx(auVar30,auVar25,auVar29);
                    *(undefined1 (*) [32])((long)*b + lVar16) = auVar25;
                    auVar29 = vpcmpgtq_avx2(auVar25,auVar24._0_32_);
                    auVar29 = vblendvpd_avx(auVar24._0_32_,auVar25,auVar29);
                    auVar24 = ZEXT3264(auVar29);
                    auVar25 = vpsubq_avx2(auVar25,auVar22);
                    auVar30 = vpsubq_avx2(auVar30,auVar23);
                    auVar31 = ZEXT3264(auVar30);
                    auVar25 = vpcmpgtq_avx2(auVar30,auVar25);
                    if ((((auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         SUB321(auVar25 >> 0x7f,0) == '\0') && SUB321(auVar25 >> 0xbf,0) == '\0') &&
                        -1 < auVar25[0x1f]) goto LAB_00773959;
                    lVar16 = lVar16 + 0x20;
                  } while (uVar19 << 5 != lVar16);
                  iVar15 = iVar15 + 1;
                } while (iVar15 != 4);
LAB_00773959:
                auVar25 = vpcmpgtq_avx2(auVar29,auVar26._0_32_);
                if ((((auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') || SUB321(auVar25 >> 0xbf,0) != '\0') ||
                    auVar25[0x1f] < '\0') {
                  lVar16 = auVar29._0_8_;
                  if (auVar29._0_8_ < auVar29._16_8_) {
                    lVar16 = auVar29._16_8_;
                  }
                  lVar11 = vpextrq_avx(auVar29._0_16_,1);
                  lVar17 = vpextrq_avx(auVar29._16_16_,1);
                  if (lVar11 < lVar17) {
                    lVar11 = lVar17;
                  }
                  if (lVar11 <= lVar16) {
                    lVar11 = lVar16;
                  }
                  if ((long)(~(long)iVar7 + 0x7fffffffffffffffU) < lVar11) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    s2Len = uVar12;
                    goto LAB_007739c9;
                  }
                  auVar26 = ZEXT3264(CONCAT824(lVar11,CONCAT816(lVar11,CONCAT88(lVar11,lVar11))));
                  uVar18 = uVar12;
                }
                uVar13 = uVar13 + 1;
                palVar8 = ptr;
                palVar9 = palVar20;
                if (uVar13 == (uint)s2Len) {
LAB_007739c9:
                  if (lVar11 == 0x7fffffffffffffff) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar7 = parasail_result_is_saturated(result);
                  palVar8 = palVar20;
                  if (iVar7 == 0) {
                    palVar9 = ptr;
                    if (uVar18 == s2Len - 2U) {
                      palVar8 = ptr;
                      palVar9 = palVar20;
                    }
                    if (uVar18 == s2Len - 1U) {
                      palVar8 = b;
                      b = palVar20;
                      palVar9 = ptr;
                    }
                    ptr = palVar9;
                    uVar14 = uVar14 - 1;
                    if ((uVar10 & 0x7ffffffc) != 0) {
                      if ((uVar10 & 0x7ffffffc) == 0) {
                        uVar10 = 0;
                        do {
                          if (((*palVar8)[uVar10] == lVar11) &&
                             (uVar12 = ((uint)uVar10 & 3) * uVar36 |
                                       (uint)(uVar10 >> 2) & 0x3fffffff, (int)uVar12 < (int)uVar14))
                          {
                            uVar14 = uVar12;
                          }
                          uVar10 = uVar10 + 1;
                        } while ((uVar36 & 0x1fffffff) << 2 != (int)uVar10);
                      }
                      else {
                        auVar21._4_4_ = uVar14;
                        auVar21._0_4_ = uVar14;
                        auVar21._8_4_ = uVar14;
                        auVar21._12_4_ = uVar14;
                        auVar27._4_4_ = uVar36;
                        auVar27._0_4_ = uVar36;
                        auVar27._8_4_ = uVar36;
                        auVar27._12_4_ = uVar36;
                        auVar6 = vpmovsxbd_avx(ZEXT416(0x3020100));
                        uVar19 = 0;
                        auVar32._8_4_ = 3;
                        auVar32._0_8_ = 0x300000003;
                        auVar32._12_4_ = 3;
                        auVar33._8_4_ = 4;
                        auVar33._0_8_ = 0x400000004;
                        auVar33._12_4_ = 4;
                        do {
                          plVar1 = *palVar8 + uVar19;
                          auVar34._0_8_ = -(ulong)(lVar11 == *plVar1);
                          auVar34._8_8_ = -(ulong)(lVar11 == plVar1[1]);
                          auVar29._16_8_ =
                               -(ulong)(lVar11 == SUB248(*(undefined1 (*) [24])plVar1,0x10));
                          auVar29._0_16_ = auVar34;
                          auVar29._24_8_ = -(ulong)(lVar11 == plVar1[3]);
                          auVar34 = vpackssdw_avx(auVar34,auVar29._16_16_);
                          auVar35 = vpsrld_avx(auVar6,2);
                          auVar5 = vpand_avx(auVar6,auVar32);
                          auVar5 = vpmulld_avx(auVar5,auVar27);
                          auVar5 = vpaddd_avx(auVar5,auVar35);
                          auVar5 = vpminsd_avx(auVar5,auVar21);
                          auVar21 = vblendvps_avx(auVar21,auVar5,auVar34);
                          uVar19 = uVar19 + 4;
                          auVar6 = vpaddd_avx(auVar6,auVar33);
                        } while (((uint)uVar10 & 0x7ffffffc) != uVar19);
                        auVar6 = vpshufd_avx(auVar21,0xee);
                        auVar21 = vpminsd_avx(auVar21,auVar6);
                        auVar6 = vpshufd_avx(auVar21,0x55);
                        auVar21 = vpminsd_avx(auVar21,auVar6);
                        uVar14 = auVar21._0_4_;
                      }
                    }
                  }
                  else {
                    uVar18 = 0;
                    lVar11 = 0xffffffff;
                    uVar14 = 0;
                  }
                  result->score = (int)lVar11;
                  result->end_query = uVar14;
                  result->end_ref = uVar18;
                  parasail_free(b_00);
                  parasail_free(palVar8);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int64_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi64_rpl(vH, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            vH = _mm256_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi64(vH, vGapO);
            vE = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
                vH = _mm256_sub_epi64(vH, vGapO);
                vF = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi64(vF, vH))) goto end;
                /*vF = _mm256_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi64(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}